

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkheader.c
# Opt level: O3

ktx_error_code_e ktxCheckHeader1_(KTX_header *pHeader,KTX_supplemental_info *pSuppInfo)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ktx_uint32_t kVar4;
  byte bVar5;
  uint uVar6;
  
  if ((pHeader == (KTX_header *)0x0) || (pSuppInfo == (KTX_supplemental_info *)0x0)) {
    __assert_fail("pHeader != NULL && pSuppInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/checkheader.c"
                  ,0x3a,"ktx_error_code_e ktxCheckHeader1_(KTX_header *, KTX_supplemental_info *)");
  }
  if (*(int *)(pHeader->identifier + 8) != 0xa1a0a0d ||
      *(long *)pHeader->identifier != -0x44cecedfa7abb455) {
    return KTX_UNKNOWN_FILE_FORMAT;
  }
  if (pHeader->endianness != 0x4030201) {
    if (pHeader->endianness != 0x1020304) {
      return KTX_FILE_DATA_ERROR;
    }
    _ktxSwapEndian32(&pHeader->glType,0xc);
    if (4 < pHeader->glTypeSize) {
      return KTX_FILE_DATA_ERROR;
    }
    if ((0x16U >> (pHeader->glTypeSize & 0x1f) & 1) == 0) {
      return KTX_FILE_DATA_ERROR;
    }
  }
  pSuppInfo->compressed = '\0';
  kVar4 = pHeader->glFormat;
  if (pHeader->glType == 0) {
LAB_001df475:
    if (pHeader->glType + kVar4 != 0) {
      return KTX_FILE_DATA_ERROR;
    }
    pSuppInfo->compressed = '\x01';
  }
  else if (kVar4 == 0) {
    kVar4 = 0;
    goto LAB_001df475;
  }
  if (kVar4 == pHeader->glInternalformat) {
    return KTX_FILE_DATA_ERROR;
  }
  uVar1 = pHeader->pixelWidth;
  if (uVar1 == 0) {
    return KTX_FILE_DATA_ERROR;
  }
  uVar6 = pHeader->pixelHeight;
  uVar2 = pHeader->pixelDepth;
  if (uVar2 == 0) {
    if (uVar6 != 0) {
      pSuppInfo->textureDimension = 2;
      bVar3 = true;
      goto LAB_001df4c6;
    }
    pSuppInfo->textureDimension = 1;
    uVar6 = 0;
  }
  else {
    if (uVar6 == 0) {
      return KTX_FILE_DATA_ERROR;
    }
    if (pHeader->numberOfArrayElements != 0) {
      return KTX_UNSUPPORTED_FEATURE;
    }
    pSuppInfo->textureDimension = 3;
  }
  bVar3 = false;
LAB_001df4c6:
  if (pHeader->numberOfFaces != 1) {
    if (pHeader->numberOfFaces != 6) {
      return KTX_FILE_DATA_ERROR;
    }
    if (!bVar3) {
      return KTX_FILE_DATA_ERROR;
    }
  }
  kVar4 = pHeader->numberOfMipLevels;
  if (kVar4 == 0) {
    pHeader->numberOfMipLevels = 1;
    bVar5 = 0;
  }
  else {
    bVar5 = (char)kVar4 - 1;
  }
  if (uVar6 < uVar1) {
    uVar6 = uVar1;
  }
  if (uVar6 <= uVar2) {
    uVar6 = uVar2;
  }
  pSuppInfo->generateMipmaps = kVar4 == 0;
  return (uint)(uVar6 >> (bVar5 & 0x1f) == 0);
}

Assistant:

KTX_error_code  ktxCheckHeader1_(KTX_header* pHeader,
                                 KTX_supplemental_info* pSuppInfo)
{
    ktx_uint8_t identifier_reference[12] = KTX_IDENTIFIER_REF;
    ktx_uint32_t max_dim;

    assert(pHeader != NULL && pSuppInfo != NULL);

    /* Compare identifier, is this a KTX file? */
    if (memcmp(pHeader->identifier, identifier_reference, 12) != 0)
    {
        return KTX_UNKNOWN_FILE_FORMAT;
    }

    if (pHeader->endianness == KTX_ENDIAN_REF_REV)
    {
        /* Convert endianness of pHeader fields. */
        _ktxSwapEndian32(&pHeader->glType, 12);

        if (pHeader->glTypeSize != 1 &&
            pHeader->glTypeSize != 2 &&
            pHeader->glTypeSize != 4)
        {
            /* Only 8-, 16-, and 32-bit types supported so far. */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->endianness != KTX_ENDIAN_REF)
    {
        return KTX_FILE_DATA_ERROR;
    }

    /* Check glType and glFormat */
    pSuppInfo->compressed = 0;
    if (pHeader->glType == 0 || pHeader->glFormat == 0)
    {
        if (pHeader->glType + pHeader->glFormat != 0)
        {
            /* either both or none of glType, glFormat must be zero */
            return KTX_FILE_DATA_ERROR;
        }
        pSuppInfo->compressed = 1;
    }

    if (pHeader->glFormat == pHeader->glInternalformat) {
        // glInternalFormat is either unsized (which is no longer and should
        // never have been supported by libktx) or glFormat is sized.
        return KTX_FILE_DATA_ERROR;
    }

    /* Check texture dimensions. KTX files can store 8 types of textures:
       1D, 2D, 3D, cube, and array variants of these. There is currently
       no GL extension for 3D array textures. */
    if ((pHeader->pixelWidth == 0) ||
        (pHeader->pixelDepth > 0 && pHeader->pixelHeight == 0))
    {
        /* texture must have width */
        /* texture must have height if it has depth */
        return KTX_FILE_DATA_ERROR;
    }


    if (pHeader->pixelDepth > 0)
    {
        if (pHeader->numberOfArrayElements > 0)
        {
            /* No 3D array textures yet. */
            return KTX_UNSUPPORTED_FEATURE;
        }
        pSuppInfo->textureDimension = 3;
    }
    else if (pHeader->pixelHeight > 0)
    {
        pSuppInfo->textureDimension = 2;
    }
    else
    {
        pSuppInfo->textureDimension = 1;
    }

    if (pHeader->numberOfFaces == 6)
    {
        if (pSuppInfo->textureDimension != 2)
        {
            /* cube map needs 2D faces */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->numberOfFaces != 1)
    {
        /* numberOfFaces must be either 1 or 6 */
        return KTX_FILE_DATA_ERROR;
    }

    /* Check number of mipmap levels */
    if (pHeader->numberOfMipLevels == 0)
    {
        pSuppInfo->generateMipmaps = 1;
        pHeader->numberOfMipLevels = 1;
    }
    else
    {
        pSuppInfo->generateMipmaps = 0;
    }

    /* This test works for arrays too because height or depth will be 0. */
    max_dim = MAX(MAX(pHeader->pixelWidth, pHeader->pixelHeight), pHeader->pixelDepth);
    if (max_dim < ((ktx_uint32_t)1 << (pHeader->numberOfMipLevels - 1)))
    {
        /* Can't have more mip levels than 1 + log2(max(width, height, depth)) */
        return KTX_FILE_DATA_ERROR;
    }

    return KTX_SUCCESS;
}